

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::SerializeWithCachedSizes
          (WordEmbedding *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  if (this->revision_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->revision_,output);
  }
  psVar1 = (this->language_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.WordEmbedding.language");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (10,(this->language_).ptr_,output);
  }
  psVar1 = (this->modelparameterdata_).ptr_;
  if (psVar1->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(100,psVar1,output);
    return;
  }
  return;
}

Assistant:

void WordEmbedding::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 revision = 1;
  if (this->revision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->revision(), output);
  }

  // string language = 10;
  if (this->language().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->language().data(), this->language().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.WordEmbedding.language");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->language(), output);
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      100, this->modelparameterdata(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.WordEmbedding)
}